

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

void __thiscall doctest::anon_unknown_14::ConsoleReporter::subcase_end(ConsoleReporter *this)

{
  mutex *__mutex;
  uint uVar1;
  int iVar2;
  undefined8 uVar3;
  char *success_str;
  AssertData *in_RSI;
  ConsoleReporter *this_00;
  
  uVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->mutex);
  if (uVar1 == 0) {
    this->currentSubcaseLevel = this->currentSubcaseLevel - 1;
    this->hasLoggedCurrentTestStart = false;
    pthread_mutex_unlock((pthread_mutex_t *)&this->mutex);
    return;
  }
  this_00 = (ConsoleReporter *)(ulong)uVar1;
  std::__throw_system_error(uVar1);
  if (((in_RSI->m_failed != false) || (this_00->opt->success == true)) &&
     (this_00->tc->m_no_output == false)) {
    __mutex = &this_00->mutex;
    iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
    if (iVar2 == 0) {
      logTestStart(this_00);
      success_str = " ";
      (*(this_00->super_IReporter)._vptr_IReporter[0xe])
                (this_00,in_RSI->m_file,(ulong)(uint)in_RSI->m_line);
      successOrFailColoredStringToStream
                (this_00,(bool)(in_RSI->m_failed ^ 1),in_RSI->m_at,success_str);
      fulltext_log_assert_to_stream(this_00->s,in_RSI);
      log_contexts(this_00);
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      return;
    }
    uVar3 = std::__throw_system_error(iVar2);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    _Unwind_Resume(uVar3);
  }
  return;
}

Assistant:

void subcase_end() override {
            std::lock_guard<std::mutex> lock(mutex);
            --currentSubcaseLevel;
            hasLoggedCurrentTestStart = false;
        }